

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O2

bool __thiscall QFileDevice::atEnd(QFileDevice *this)

{
  QFileDevicePrivate *this_00;
  QAbstractFileEngine *pQVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this_00 = (QFileDevicePrivate *)
            (this->super_QIODevice).d_ptr._M_t.
            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
            super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  bVar2 = QIODevicePrivate::isBufferEmpty((QIODevicePrivate *)this_00);
  if (bVar2) {
    bVar2 = QIODevice::isOpen(&this->super_QIODevice);
    if (!bVar2) {
      return true;
    }
    bVar2 = QFileDevicePrivate::ensureFlushed(this_00);
    if (bVar2) {
      pQVar1 = (this_00->fileEngine)._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
      iVar3 = (*pQVar1->_vptr_QAbstractFileEngine[0x27])(pQVar1,0);
      if ((char)iVar3 != '\0') {
        bVar2 = QAbstractFileEngine::atEnd
                          ((this_00->fileEngine)._M_t.
                           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                           .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
        return bVar2;
      }
      iVar3 = (*(this->super_QIODevice)._vptr_QIODevice[5])(this);
      if (this_00->cachedSize <= CONCAT44(extraout_var,iVar3)) {
        iVar3 = (*(this->super_QIODevice)._vptr_QIODevice[10])(this);
        return CONCAT44(extraout_var_00,iVar3) == 0;
      }
    }
  }
  return false;
}

Assistant:

bool QFileDevice::atEnd() const
{
    Q_D(const QFileDevice);

    // If there's buffered data left, we're not at the end.
    if (!d->isBufferEmpty())
        return false;

    if (!isOpen())
        return true;

    if (!d->ensureFlushed())
        return false;

    // If the file engine knows best, say what it says.
    if (d->fileEngine->supportsExtension(QAbstractFileEngine::AtEndExtension)) {
        // Check if the file engine supports AtEndExtension, and if it does,
        // check if the file engine claims to be at the end.
        return d->fileEngine->atEnd();
    }

    // if it looks like we are at the end, or if size is not cached,
    // fall through to bytesAvailable() to make sure.
    if (pos() < d->cachedSize)
        return false;

    // Fall back to checking how much is available (will stat files).
    return bytesAvailable() == 0;
}